

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

void __thiscall btGeneric6DofConstraint::calculateAngleInfo(btGeneric6DofConstraint *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  btMatrix3x3 local_38;
  
  fVar7 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
  fVar8 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar16 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar15 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
  fVar18 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar9 = fVar7 * fVar8 - fVar15 * fVar16;
  fVar19 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar14 = fVar16 * fVar18 - fVar8 * fVar19;
  fVar11 = fVar19 * fVar15 - fVar18 * fVar7;
  fVar20 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar17 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
  fVar13 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar21 = 1.0 / (fVar13 * fVar11 + fVar20 * fVar9 + fVar17 * fVar14);
  fVar9 = fVar9 * fVar21;
  fVar6 = (fVar13 * fVar15 - fVar8 * fVar17) * fVar21;
  fVar12 = (fVar17 * fVar16 - fVar7 * fVar13) * fVar21;
  fVar14 = fVar14 * fVar21;
  fVar10 = (fVar20 * fVar8 - fVar18 * fVar13) * fVar21;
  fVar13 = (fVar13 * fVar19 - fVar16 * fVar20) * fVar21;
  fVar11 = fVar11 * fVar21;
  fVar15 = (fVar17 * fVar18 - fVar15 * fVar20) * fVar21;
  fVar21 = (fVar20 * fVar7 - fVar19 * fVar17) * fVar21;
  fVar7 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
  fVar8 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
  fVar16 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
  local_38.m_el[0].m_floats[2] = fVar16 * fVar12 + fVar7 * fVar9 + fVar6 * fVar8;
  local_38.m_el[1].m_floats[2] = fVar16 * fVar13 + fVar7 * fVar14 + fVar10 * fVar8;
  local_38.m_el[2].m_floats[2] = fVar16 * fVar21 + fVar7 * fVar11 + fVar8 * fVar15;
  uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
  uVar2 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats;
  fVar19 = (float)uVar2;
  fVar20 = (float)((ulong)uVar2 >> 0x20);
  fVar16 = (float)uVar1;
  fVar18 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats;
  fVar7 = (float)uVar1;
  fVar8 = (float)((ulong)uVar1 >> 0x20);
  local_38.m_el[0].m_floats[1] = fVar12 * fVar8 + fVar9 * fVar18 + fVar6 * fVar20;
  local_38.m_el[0].m_floats[0] = fVar12 * fVar7 + fVar9 * fVar16 + fVar6 * fVar19;
  local_38.m_el[0].m_floats[3] = 0.0;
  local_38.m_el[1].m_floats[1] = fVar13 * fVar8 + fVar14 * fVar18 + fVar10 * fVar20;
  local_38.m_el[1].m_floats[0] = fVar13 * fVar7 + fVar14 * fVar16 + fVar10 * fVar19;
  local_38.m_el[1].m_floats[3] = 0.0;
  local_38.m_el[2].m_floats[1] = fVar21 * fVar8 + fVar11 * fVar18 + fVar15 * fVar20;
  local_38.m_el[2].m_floats[0] = fVar21 * fVar7 + fVar11 * fVar16 + fVar15 * fVar19;
  local_38.m_el[2].m_floats[3] = 0.0;
  matrixToEulerXYZ(&local_38,&this->m_calculatedAxisAngleDiff);
  fVar7 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
  fVar8 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  fVar16 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar15 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar18 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar19 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  auVar4._4_4_ = fVar18 * fVar7 - fVar19 * fVar16;
  auVar4._0_4_ = fVar15 * fVar19 - fVar8 * fVar18;
  auVar4._8_4_ = fVar16 * fVar8 - fVar7 * fVar15;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[1].m_floats = auVar4;
  fVar20 = this->m_calculatedAxis[1].m_floats[0];
  uVar1 = *(undefined8 *)(this->m_calculatedAxis[1].m_floats + 1);
  fVar17 = (float)uVar1;
  fVar13 = (float)((ulong)uVar1 >> 0x20);
  auVar3._4_4_ = fVar16 * fVar13 - fVar18 * fVar20;
  auVar3._0_4_ = fVar18 * fVar17 - fVar15 * fVar13;
  auVar3._8_4_ = fVar15 * fVar20 - fVar16 * fVar17;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar3;
  auVar5._4_4_ = fVar20 * fVar19 - fVar7 * fVar13;
  auVar5._0_4_ = fVar13 * fVar8 - fVar19 * fVar17;
  auVar5._8_4_ = fVar7 * fVar17 - fVar20 * fVar8;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[2].m_floats = auVar5;
  fVar7 = this->m_calculatedAxis[0].m_floats[0];
  fVar8 = this->m_calculatedAxis[0].m_floats[1];
  fVar16 = this->m_calculatedAxis[0].m_floats[2];
  fVar7 = fVar16 * fVar16 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  uVar1 = *(undefined8 *)this->m_calculatedAxis[0].m_floats;
  *(ulong *)this->m_calculatedAxis[0].m_floats =
       CONCAT44(fVar7 * (float)((ulong)uVar1 >> 0x20),fVar7 * (float)uVar1);
  this->m_calculatedAxis[0].m_floats[2] = fVar7 * this->m_calculatedAxis[0].m_floats[2];
  fVar7 = this->m_calculatedAxis[1].m_floats[0];
  fVar8 = this->m_calculatedAxis[1].m_floats[1];
  fVar16 = this->m_calculatedAxis[1].m_floats[2];
  fVar7 = fVar16 * fVar16 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  uVar1 = *(undefined8 *)this->m_calculatedAxis[1].m_floats;
  *(ulong *)this->m_calculatedAxis[1].m_floats =
       CONCAT44(fVar7 * (float)((ulong)uVar1 >> 0x20),fVar7 * (float)uVar1);
  this->m_calculatedAxis[1].m_floats[2] = fVar7 * this->m_calculatedAxis[1].m_floats[2];
  fVar7 = this->m_calculatedAxis[2].m_floats[0];
  fVar8 = this->m_calculatedAxis[2].m_floats[1];
  fVar16 = this->m_calculatedAxis[2].m_floats[2];
  fVar7 = fVar16 * fVar16 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  uVar1 = *(undefined8 *)this->m_calculatedAxis[2].m_floats;
  *(ulong *)this->m_calculatedAxis[2].m_floats =
       CONCAT44(fVar7 * (float)((ulong)uVar1 >> 0x20),fVar7 * (float)uVar1);
  this->m_calculatedAxis[2].m_floats[2] = fVar7 * this->m_calculatedAxis[2].m_floats[2];
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff);
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
	btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);

	m_calculatedAxis[1] = axis2.cross(axis0);
	m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
	m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}